

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O0

void bcemit_method(FuncState *fs,ExpDesc *e,ExpDesc *key)

{
  uint32_t uVar1;
  BCReg BVar2;
  BCReg BVar3;
  BCReg obj;
  BCReg func;
  BCReg idx;
  ExpDesc *key_local;
  ExpDesc *e_local;
  FuncState *fs_local;
  
  BVar2 = expr_toanyreg(fs,e);
  expr_free(fs,e);
  uVar1 = fs->freereg;
  bcemit_INS(fs,(uVar1 + 2) * 0x100 | 0x12 | BVar2 << 0x10);
  BVar3 = const_str(fs,key);
  if (BVar3 < 0x100) {
    bcreg_reserve(fs,3);
    bcemit_INS(fs,uVar1 << 8 | 0x39 | BVar2 << 0x18 | BVar3 << 0x10);
  }
  else {
    bcreg_reserve(fs,4);
    bcemit_INS(fs,(uVar1 + 3) * 0x100 | 0x27 | BVar3 << 0x10);
    bcemit_INS(fs,uVar1 << 8 | 0x38 | BVar2 << 0x18 | (uVar1 + 3) * 0x10000);
    fs->freereg = fs->freereg - 1;
  }
  (e->u).s.info = uVar1;
  e->k = VNONRELOC;
  return;
}

Assistant:

static void bcemit_method(FuncState *fs, ExpDesc *e, ExpDesc *key)
{
  BCReg idx, func, obj = expr_toanyreg(fs, e);
  expr_free(fs, e);
  func = fs->freereg;
  bcemit_AD(fs, BC_MOV, func+1+LJ_FR2, obj);  /* Copy object to 1st argument. */
  lj_assertFS(expr_isstrk(key), "bad usage");
  idx = const_str(fs, key);
  if (idx <= BCMAX_C) {
    bcreg_reserve(fs, 2+LJ_FR2);
    bcemit_ABC(fs, BC_TGETS, func, obj, idx);
  } else {
    bcreg_reserve(fs, 3+LJ_FR2);
    bcemit_AD(fs, BC_KSTR, func+2+LJ_FR2, idx);
    bcemit_ABC(fs, BC_TGETV, func, obj, func+2+LJ_FR2);
    fs->freereg--;
  }
  e->u.s.info = func;
  e->k = VNONRELOC;
}